

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O0

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
::vine_swap_with_z_eq_1_case
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  bool bVar1;
  bool bVar2;
  bool col2IsNeg;
  bool col1IsNeg;
  Index columnIndex2_local;
  Index columnIndex1_local;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
  *this_local;
  
  bVar1 = _is_negative_in_pair(this,columnIndex1);
  bVar2 = _is_negative_in_pair(this,columnIndex2);
  if ((bVar1) && (bVar2)) {
    this_local._4_4_ = _negative_vine_swap(this,columnIndex1,columnIndex2);
  }
  else if (bVar1) {
    this_local._4_4_ = _negative_positive_vine_swap(this,columnIndex1,columnIndex2);
  }
  else if (bVar2) {
    this_local._4_4_ = _positive_negative_vine_swap(this,columnIndex1,columnIndex2);
  }
  else {
    this_local._4_4_ = _positive_vine_swap(this,columnIndex1,columnIndex2);
  }
  return this_local._4_4_;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap_with_z_eq_1_case(
    Index columnIndex1, Index columnIndex2)
{
  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) return _negative_vine_swap(columnIndex1, columnIndex2);

  if (col1IsNeg) return _negative_positive_vine_swap(columnIndex1, columnIndex2);

  if (col2IsNeg) return _positive_negative_vine_swap(columnIndex1, columnIndex2);

  return _positive_vine_swap(columnIndex1, columnIndex2);
}